

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case0356(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_6fe;
  allocator<char> local_6fd;
  allocator<char> local_6fc;
  allocator<char> local_6fb;
  allocator<char> local_6fa;
  allocator<char> local_6f9;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658 [32];
  Expectation local_638;
  Expectation local_580;
  Decl local_4c8;
  Decl local_400;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"void x ( y * ( * z ) [ 1 ] , int w ) ;",&local_6f9);
  Expectation::Expectation(&local_638);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"x",&local_6fa);
  pDVar1 = Decl::Function(&local_1a8,&local_678,File);
  pDVar1 = Ty::Void(&pDVar1->ty_,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"y",&local_6fb);
  pDVar1 = Ty::Typedef(pTVar2,&local_698,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Array,None,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Int_S,None);
  Decl::Decl(&local_e0,pDVar1);
  pEVar3 = Expectation::declaration(&local_638,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"w",&local_6fc);
  pDVar1 = Decl::Object(&local_338,&local_6b8,ParameterDeclaration,FunctionPrototype);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_270,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_270);
  Decl::Decl(&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"z",&local_6fd);
  pDVar1 = Decl::Object(&local_4c8,&local_6d8,ParameterDeclaration,FunctionPrototype);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"y",&local_6fe);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_6f8,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Array,None,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_400,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_400);
  Expectation::Expectation(&local_580,pEVar3);
  bind(this,(int)local_658,(sockaddr *)&local_580,__len);
  Expectation::~Expectation(&local_580);
  Decl::~Decl(&local_400);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_6d8);
  Decl::~Decl(&local_4c8);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_6b8);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  Decl::~Decl(&local_1a8);
  Expectation::~Expectation(&local_638);
  std::__cxx11::string::~string(local_658);
  return;
}

Assistant:

void DeclarationBinderTester::case0356()
{
    bind("void x ( y * ( * z ) [ 1 ] , int w ) ;",
         Expectation()
         .declaration(Decl()
                  .Function("x", ScopeKind::File)
                  .ty_.Void()
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("y")
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.atParam().Derived(TypeKind::Array)
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.addParam().Basic(BasicTypeKind::Int_S))
         .declaration(Decl()
                  .Object("w", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Basic(BasicTypeKind::Int_S))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Typedef("y")
                  .ty_.Derived(TypeKind::Pointer)
                  .ty_.Derived(TypeKind::Array)
                  .ty_.Derived(TypeKind::Pointer)));
}